

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexturehelper.cpp
# Opt level: O1

void __thiscall
QOpenGLTextureHelper::qt_TextureParameterf
          (QOpenGLTextureHelper *this,GLuint texture,GLenum target,GLenum bindingTarget,GLenum pname
          ,GLfloat param)

{
  QOpenGLFunctions *pQVar1;
  GLenum GVar2;
  GLenum GVar3;
  long in_FS_OFFSET;
  bool bVar4;
  undefined4 auStack_3c [3];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  auStack_3c[0] = 0xaaaaaaaa;
  pQVar1 = this->functions;
  bVar4 = 5 < target - 0x8515;
  GVar2 = 0x8513;
  if (bVar4) {
    GVar2 = target;
  }
  GVar3 = 0x8514;
  if (bVar4) {
    GVar3 = bindingTarget;
  }
  (**(code **)(*(long *)pQVar1 + 200))(GVar3,auStack_3c);
  (*(code *)**(undefined8 **)pQVar1)(GVar2,texture);
  (**(code **)(*(long *)this->functions + 0x148))(param,target,pname);
  (*(code *)**(undefined8 **)pQVar1)(GVar2,auStack_3c[0]);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGLTextureHelper::qt_TextureParameterf(GLuint texture, GLenum target, GLenum bindingTarget, GLenum pname, GLfloat param)
{
    TextureBinder binder(functions, texture, target, bindingTarget);
    functions->glTexParameterf(target, pname, param);
}